

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupWithConstraints(Gia_Man_t *p,Vec_Int_t *vPoTypes)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  uint uVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pName = pcVar10;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  pVVar12 = p->vCis;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
    do {
      iVar7 = pVVar12->pArray[lVar14];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001ee3be;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) {
LAB_001ee3fc:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar11)) goto LAB_001ee3fc;
      pGVar4[iVar7].Value = (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar12 = p->vCis;
    } while (lVar14 < pVVar12->nSize);
  }
  iVar7 = p->nObjs;
  if (0 < iVar7) {
    lVar14 = 8;
    lVar15 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar5 = *(ulong *)((long)pGVar4 + lVar14 + -8);
      if ((uVar5 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar5) {
        uVar8 = *(uint *)((long)pGVar4 + lVar14 + (ulong)(uint)((int)(uVar5 & 0x1fffffff) << 2) * -3
                         );
        if (((int)uVar8 < 0) ||
           (uVar1 = *(uint *)((long)pGVar4 +
                             lVar14 + (ulong)((uint)(uVar5 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_001ee41b;
        iVar7 = Gia_ManAppendAnd(p_00,uVar8 ^ (uint)(uVar5 >> 0x1d) & 1,
                                 uVar1 ^ (uint)(uVar5 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar14) = iVar7;
        iVar7 = p->nObjs;
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar15 < iVar7);
  }
  iVar7 = p->nRegs;
  pVVar12 = p->vCos;
  iVar16 = pVVar12->nSize;
  if (iVar7 < iVar16) {
    lVar14 = 0;
    do {
      if (iVar16 <= lVar14) goto LAB_001ee3dd;
      iVar13 = pVVar12->pArray[lVar14];
      if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_001ee3be;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vPoTypes->nSize <= lVar14) goto LAB_001ee3dd;
      if (vPoTypes->pArray[lVar14] == 0) {
        pGVar4 = p->pObjs + iVar13;
        if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
        goto LAB_001ee41b;
        uVar8 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                     pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].
                                     Value);
        pGVar4->Value = uVar8;
        iVar7 = p->nRegs;
        pVVar12 = p->vCos;
      }
      lVar14 = lVar14 + 1;
      iVar16 = pVVar12->nSize;
    } while (lVar14 < iVar16 - iVar7);
  }
  iVar13 = 0;
  if (iVar7 < iVar16) {
    lVar14 = 0;
    iVar13 = 0;
    do {
      if (iVar16 <= lVar14) goto LAB_001ee3dd;
      iVar16 = pVVar12->pArray[lVar14];
      if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_001ee3be;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vPoTypes->nSize <= lVar14) goto LAB_001ee3dd;
      if (vPoTypes->pArray[lVar14] == 1) {
        pGVar4 = p->pObjs + iVar16;
        if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
        goto LAB_001ee41b;
        uVar8 = Gia_ManAppendCo(p_00,pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].
                                     Value ^ (uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^ 1);
        pGVar4->Value = uVar8;
        iVar13 = iVar13 + 1;
        iVar7 = p->nRegs;
        pVVar12 = p->vCos;
      }
      lVar14 = lVar14 + 1;
      iVar16 = pVVar12->nSize;
    } while (lVar14 < iVar16 - iVar7);
  }
  if (0 < iVar7) {
    iVar16 = 0;
    do {
      iVar2 = p->vCos->nSize;
      uVar8 = (iVar2 - iVar7) + iVar16;
      if (((int)uVar8 < 0) || (iVar2 <= (int)uVar8)) {
LAB_001ee3dd:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCos->pArray[uVar8];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_001ee3be:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar2;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0) {
LAB_001ee41b:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar8 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                   pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value)
      ;
      pGVar4->Value = uVar8;
      iVar16 = iVar16 + 1;
      iVar7 = p->nRegs;
    } while (iVar16 < iVar7);
  }
  Gia_ManSetRegNum(p_00,iVar7);
  p_00->nConstrs = iVar13;
  iVar7 = Gia_ManIsNormalized(p_00);
  if (iVar7 == 0) {
    __assert_fail("Gia_ManIsNormalized(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xd40,"Gia_Man_t *Gia_ManDupWithConstraints(Gia_Man_t *, Vec_Int_t *)");
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupWithConstraints( Gia_Man_t * p, Vec_Int_t * vPoTypes )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nConstr = 0;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vPoTypes, i) == 0 ) // regular PO
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vPoTypes, i) == 1 ) // constraint (should be complemented!)
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) ^ 1 ), nConstr++;
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
//    Gia_ManDupRemapEquiv( pNew, p );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = nConstr;
    assert( Gia_ManIsNormalized(pNew) );
    return pNew;
}